

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::StencilTexturing::FunctionalTest::iterate(FunctionalTest *this)

{
  bool bVar1;
  TestContext *pTVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  MessageBuilder local_628;
  MessageBuilder local_4a8;
  MessageBuilder local_328;
  MessageBuilder local_198;
  byte local_11;
  FunctionalTest *pFStack_10;
  bool test_result;
  FunctionalTest *this_local;
  
  local_11 = 1;
  pFStack_10 = this;
  bVar1 = test(this,0x88f0,true);
  if (!bVar1) {
    pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TestLog::operator<<(&local_198,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_198,
                        (char (*) [58])"Test failed. Case format: GL_DEPTH24_STENCIL8, channel: S");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_198);
    local_11 = 0;
  }
  bVar1 = test(this,0x88f0,false);
  if (!bVar1) {
    pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TestLog::operator<<(&local_328,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_328,
                        (char (*) [58])"Test failed. Case format: GL_DEPTH24_STENCIL8, channel: D");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_328);
    local_11 = 0;
  }
  bVar1 = test(this,0x8cad,true);
  if (!bVar1) {
    pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TestLog::operator<<(&local_4a8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_4a8,
                        (char (*) [59])"Test failed. Case format: GL_DEPTH32F_STENCIL8, channel: S")
    ;
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4a8);
    local_11 = 0;
  }
  bVar1 = test(this,0x8cad,false);
  if (!bVar1) {
    pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TestLog::operator<<(&local_628,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_628,
                        (char (*) [59])"Test failed. Case format: GL_DEPTH32F_STENCIL8, channel: D")
    ;
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_628);
    local_11 = 0;
  }
  if ((local_11 & 1) == 1) {
    pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar2 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	bool test_result = true;

	if (false == test(GL_DEPTH24_STENCIL8, true))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Test failed. Case format: GL_DEPTH24_STENCIL8, channel: S"
											<< tcu::TestLog::EndMessage;
		test_result = false;
	}

	if (false == test(GL_DEPTH24_STENCIL8, false))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Test failed. Case format: GL_DEPTH24_STENCIL8, channel: D"
											<< tcu::TestLog::EndMessage;
		test_result = false;
	}

	if (false == test(GL_DEPTH32F_STENCIL8, true))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Test failed. Case format: GL_DEPTH32F_STENCIL8, channel: S"
											<< tcu::TestLog::EndMessage;
		test_result = false;
	}

	if (false == test(GL_DEPTH32F_STENCIL8, false))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Test failed. Case format: GL_DEPTH32F_STENCIL8, channel: D"
											<< tcu::TestLog::EndMessage;
		test_result = false;
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}